

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O2

size_t duckdb_brotli::BrotliEncoderMaxCompressedSize(size_t input_size)

{
  size_t sVar1;
  ulong uVar2;
  
  if (input_size != 0) {
    uVar2 = input_size + (input_size >> 0xe) * 4 + 6;
    sVar1 = 0;
    if (input_size <= uVar2) {
      sVar1 = uVar2;
    }
    return sVar1;
  }
  return 2;
}

Assistant:

size_t duckdb_brotli::BrotliEncoderMaxCompressedSize(size_t input_size) {
  /* [window bits / empty metadata] + N * [uncompressed] + [last empty] */
  size_t num_large_blocks = input_size >> 14;
  size_t overhead = 2 + (4 * num_large_blocks) + 3 + 1;
  size_t result = input_size + overhead;
  if (input_size == 0) return 2;
  return (result < input_size) ? 0 : result;
}